

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClassifier.h
# Opt level: O2

size_t __thiscall
Js::CharClassifier::SkipBiDirectionalChars
          (CharClassifier *this,LPCOLESTR psz,size_t startIndex,size_t length)

{
  bool bVar1;
  size_t sVar2;
  
  sVar2 = 0;
  while( true ) {
    if (length <= startIndex) {
      return 0;
    }
    bVar1 = IsBiDirectionalChar(this,(uint)(ushort)psz[startIndex + sVar2]);
    if (!bVar1) break;
    sVar2 = sVar2 + 1;
  }
  return sVar2;
}

Assistant:

size_t SkipBiDirectionalChars(_In_z_bytecount_(2 * length) LPCOLESTR psz, _In_ size_t startIndex, _In_ size_t length) const
        {
            size_t count = 0;
            while (startIndex < length)
            {
                if (!IsBiDirectionalChar(psz[startIndex + count]))
                {
                    return count;
                }

                count++;
            }

            return count;
        }